

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int EncodeAlphaInternal(uint8_t *data,int width,int height,int method,int filter,int reduce_levels,
                       int effort_level,uint8_t *tmp_alpha,FilterTrial *result)

{
  int iVar1;
  size_t sVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  VP8LBitWriter tmp_bw;
  size_t output_size;
  uint8_t *output;
  size_t data_size;
  uint8_t header;
  WebPFilterFunc filter_func;
  uint8_t *alpha_src;
  int ok;
  VP8LBitWriter *in_stack_000000e0;
  int in_stack_000000e8;
  int in_stack_000000ec;
  int in_stack_000000f0;
  int in_stack_000000f4;
  uint8_t *in_stack_000000f8;
  WebPAuxStats *in_stack_00000110;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  byte bVar3;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  bool bVar4;
  undefined1 in_stack_ffffffffffffff77;
  bool bVar5;
  VP8BitWriter *in_stack_ffffffffffffff78;
  int local_60;
  int local_1c;
  
  bVar5 = false;
  if (WebPFilters[in_R8D] != (WebPFilterFunc)0x0) {
    (*WebPFilters[in_R8D])(in_RDI,in_ESI,in_EDX,in_ESI,(uint8_t *)tmp_bw.bits_);
  }
  local_1c = in_ECX;
  if (in_ECX != 0) {
    iVar1 = VP8LBitWriterInit((VP8LBitWriter *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              in_stack_ffffffffffffff68);
    bVar5 = false;
    if (iVar1 != 0) {
      in_stack_ffffffffffffff68 = tmp_bw._8_8_ + 0x38;
      iVar1 = EncodeLossless(in_stack_000000f8,in_stack_000000f4,in_stack_000000f0,in_stack_000000ec
                             ,in_stack_000000e8,in_stack_000000e0,in_stack_00000110);
      bVar5 = iVar1 != 0;
    }
    if (bVar5 == false) {
      VP8LBitWriterWipeOut((VP8LBitWriter *)0x176019);
      memset((void *)(tmp_bw._8_8_ + 8),0,0x30);
      return 0;
    }
    in_stack_ffffffffffffff77 = bVar5;
    VP8LBitWriterFinish((VP8LBitWriter *)0x175fa2);
    if (local_60 != 0) {
      VP8LBitWriterWipeOut((VP8LBitWriter *)0x175fb8);
      memset((void *)(tmp_bw._8_8_ + 8),0,0x30);
      return 0;
    }
    sVar2 = VP8LBitWriterNumBytes((VP8LBitWriter *)&stack0xffffffffffffff78);
    if ((ulong)(long)(in_ESI * in_EDX) < sVar2) {
      local_1c = 0;
      VP8LBitWriterWipeOut((VP8LBitWriter *)0x17600d);
    }
  }
  if (local_1c == 0) {
    bVar5 = true;
  }
  iVar1 = VP8BitWriterInit((VP8BitWriter *)
                           CONCAT17(in_stack_ffffffffffffff77,
                                    CONCAT16(in_stack_ffffffffffffff76,
                                             CONCAT15(in_stack_ffffffffffffff75,
                                                      CONCAT14(in_stack_ffffffffffffff74,
                                                               in_stack_ffffffffffffff70)))),
                           in_stack_ffffffffffffff68);
  if (iVar1 == 0) {
    bVar5 = false;
  }
  bVar4 = false;
  if (bVar5 != false) {
    iVar1 = VP8BitWriterAppend(in_stack_ffffffffffffff78,
                               (uint8_t *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        (uint7)CONCAT15(in_stack_ffffffffffffff75,
                                                        CONCAT14(in_stack_ffffffffffffff74,
                                                                 in_stack_ffffffffffffff70))),
                               in_stack_ffffffffffffff68);
    bVar4 = iVar1 != 0;
  }
  bVar5 = false;
  if (bVar4 != false) {
    iVar1 = VP8BitWriterAppend(in_stack_ffffffffffffff78,
                               (uint8_t *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(bVar4,(uint6)CONCAT14(in_stack_ffffffffffffff74,
                                                                       in_stack_ffffffffffffff70))),
                               in_stack_ffffffffffffff68);
    bVar5 = iVar1 != 0;
  }
  if (local_1c != 0) {
    VP8LBitWriterWipeOut((VP8LBitWriter *)0x176140);
  }
  bVar3 = 0;
  if (bVar5) {
    bVar3 = *(int *)(tmp_bw._8_8_ + 0x30) != 0 ^ 0xff;
  }
  sVar2 = VP8BitWriterSize((VP8BitWriter *)(tmp_bw._8_8_ + 8));
  *(size_t *)tmp_bw._8_8_ = sVar2;
  return (uint)(bVar3 & 1);
}

Assistant:

static int EncodeAlphaInternal(const uint8_t* const data, int width, int height,
                               int method, int filter, int reduce_levels,
                               int effort_level,  // in [0..6] range
                               uint8_t* const tmp_alpha,
                               FilterTrial* result) {
  int ok = 0;
  const uint8_t* alpha_src;
  WebPFilterFunc filter_func;
  uint8_t header;
  const size_t data_size = width * height;
  const uint8_t* output = NULL;
  size_t output_size = 0;
  VP8LBitWriter tmp_bw;

  assert((uint64_t)data_size == (uint64_t)width * height);  // as per spec
  assert(filter >= 0 && filter < WEBP_FILTER_LAST);
  assert(method >= ALPHA_NO_COMPRESSION);
  assert(method <= ALPHA_LOSSLESS_COMPRESSION);
  assert(sizeof(header) == ALPHA_HEADER_LEN);

  filter_func = WebPFilters[filter];
  if (filter_func != NULL) {
    filter_func(data, width, height, width, tmp_alpha);
    alpha_src = tmp_alpha;
  }  else {
    alpha_src = data;
  }

  if (method != ALPHA_NO_COMPRESSION) {
    ok = VP8LBitWriterInit(&tmp_bw, data_size >> 3);
    ok = ok && EncodeLossless(alpha_src, width, height, effort_level,
                              !reduce_levels, &tmp_bw, &result->stats);
    if (ok) {
      output = VP8LBitWriterFinish(&tmp_bw);
      if (tmp_bw.error_) {
        VP8LBitWriterWipeOut(&tmp_bw);
        memset(&result->bw, 0, sizeof(result->bw));
        return 0;
      }
      output_size = VP8LBitWriterNumBytes(&tmp_bw);
      if (output_size > data_size) {
        // compressed size is larger than source! Revert to uncompressed mode.
        method = ALPHA_NO_COMPRESSION;
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    } else {
      VP8LBitWriterWipeOut(&tmp_bw);
      memset(&result->bw, 0, sizeof(result->bw));
      return 0;
    }
  }

  if (method == ALPHA_NO_COMPRESSION) {
    output = alpha_src;
    output_size = data_size;
    ok = 1;
  }

  // Emit final result.
  header = method | (filter << 2);
  if (reduce_levels) header |= ALPHA_PREPROCESSED_LEVELS << 4;

  if (!VP8BitWriterInit(&result->bw, ALPHA_HEADER_LEN + output_size)) ok = 0;
  ok = ok && VP8BitWriterAppend(&result->bw, &header, ALPHA_HEADER_LEN);
  ok = ok && VP8BitWriterAppend(&result->bw, output, output_size);

  if (method != ALPHA_NO_COMPRESSION) {
    VP8LBitWriterWipeOut(&tmp_bw);
  }
  ok = ok && !result->bw.error_;
  result->score = VP8BitWriterSize(&result->bw);
  return ok;
}